

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O3

void __thiscall
QGraphicsScenePrivate::mousePressEventHandler
          (QGraphicsScenePrivate *this,QGraphicsSceneMouseEvent *mouseEvent)

{
  QList<QGraphicsItem_*> *this_00;
  QGraphicsScene *this_01;
  QGraphicsItem *pQVar1;
  QGraphicsItem **ppQVar2;
  bool bVar3;
  bool bVar4;
  GraphicsItemFlags GVar5;
  FocusPolicy FVar6;
  PanelModality PVar7;
  MouseButtons MVar8;
  MouseButton MVar9;
  MouseButton MVar10;
  DragMode DVar11;
  KeyboardModifiers KVar12;
  QGraphicsScenePrivate *d;
  QWidget *pQVar13;
  QGraphicsWidget *widget;
  QGraphicsWidget *pQVar14;
  long lVar15;
  QGraphicsItem **ppQVar16;
  QGraphicsView *this_02;
  long lVar17;
  QGraphicsItem **ppQVar18;
  long in_FS_OFFSET;
  bool itemIsDying;
  QPointF QVar19;
  QGraphicsItem *item;
  QGraphicsItem *topItem;
  QGraphicsItem *local_78;
  QPointF local_70;
  QPoint local_60;
  QArrayDataPointer<QGraphicsItem_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QGraphicsScene **)&this->field_0x8;
  (mouseEvent->super_QGraphicsSceneEvent).field_0xc = 0;
  lVar15 = (this->mouseGrabberItems).d.size;
  if (lVar15 == 0) {
    this_00 = &this->cachedItemsUnderMouse;
    if ((this->cachedItemsUnderMouse).d.size == 0) {
      local_60 = QGraphicsSceneMouseEvent::screenPos(mouseEvent);
      QVar19 = QGraphicsSceneMouseEvent::scenePos(mouseEvent);
      local_70.yp = QVar19.yp;
      local_70.xp = QVar19.xp;
      pQVar13 = QGraphicsSceneEvent::widget(&mouseEvent->super_QGraphicsSceneEvent);
      itemsAtPosition((QList<QGraphicsItem_*> *)&local_58,this,&local_60,&local_70,pQVar13);
      QArrayDataPointer<QGraphicsItem_*>::operator=(&this_00->d,&local_58);
      if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d)->super_QArrayData,8,0x10);
        }
      }
      if ((this->cachedItemsUnderMouse).d.size != 0) goto LAB_006026c3;
      local_60.xp.m_i = 0;
      local_60.yp.m_i = 0;
LAB_00602716:
      widget = (QGraphicsWidget *)0x0;
    }
    else {
LAB_006026c3:
      local_60 = *(QPoint *)(this->cachedItemsUnderMouse).d.ptr;
      if ((local_60 == (QPoint)0x0) ||
         (widget = QGraphicsItem::window((QGraphicsItem *)local_60),
         widget == (QGraphicsWidget *)0x0)) goto LAB_00602716;
      bVar3 = QGraphicsItem::isBlockedByModalPanel
                        (&(widget->super_QGraphicsObject).super_QGraphicsItem,
                         (QGraphicsItem **)&local_60);
      if (bVar3) {
        if (local_60 == (QPoint)0x0) goto LAB_00602716;
        widget = QGraphicsItem::window((QGraphicsItem *)local_60);
      }
    }
    lVar15 = *(long *)(this_01 + 8);
    pQVar1 = *(QGraphicsItem **)(lVar15 + 0x1a8);
    if ((pQVar1 == (QGraphicsItem *)0x0) || (bVar3 = QGraphicsItem::isWindow(pQVar1), !bVar3)) {
      pQVar14 = (QGraphicsWidget *)0x0;
    }
    else {
      lVar15 = *(long *)(lVar15 + 0x1a8);
      pQVar14 = (QGraphicsWidget *)(lVar15 + -0x10);
      if (lVar15 == 0) {
        pQVar14 = (QGraphicsWidget *)0x0;
      }
    }
    if (widget != pQVar14) {
      QGraphicsScene::setActiveWindow(this_01,widget);
    }
    lVar15 = (this->cachedItemsUnderMouse).d.size;
    bVar3 = true;
    if (lVar15 != 0) {
      ppQVar18 = (this->cachedItemsUnderMouse).d.ptr;
      lVar17 = 0;
      do {
        pQVar1 = *(QGraphicsItem **)((long)ppQVar18 + lVar17);
        bVar3 = QGraphicsItem::isBlockedByModalPanel(pQVar1,(QGraphicsItem **)0x0);
        if ((bVar3) || ((((pQVar1->d_ptr).d)->field_0x166 & 4) != 0)) {
LAB_0060283a:
          bVar3 = false;
          goto LAB_0060283c;
        }
        bVar3 = QGraphicsItem::isEnabled(pQVar1);
        if (((bVar3) &&
            (GVar5 = QGraphicsItem::flags(pQVar1),
            ((uint)GVar5.super_QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4>.
                   super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i & 4) != 0)) &&
           ((bVar3 = QGraphicsItem::isWidget(pQVar1), !bVar3 ||
            (FVar6 = QGraphicsWidget::focusPolicy((QGraphicsWidget *)(pQVar1 + -1)),
            (FVar6 & ClickFocus) != NoFocus)))) {
          if ((pQVar1 == *(QGraphicsItem **)
                          (*(long *)(this_01 + 8) + 0x188 +
                          (ulong)(*(int *)(*(long *)(this_01 + 8) + 0x1b8) < 1) * 0x10)) ||
             ((((pQVar1->d_ptr).d)->field_0x168 & 2) == 0)) goto LAB_0060283a;
          bVar3 = false;
          QGraphicsItem::setFocus(pQVar1,MouseFocusReason);
          goto LAB_0060283c;
        }
        bVar3 = QGraphicsItem::isPanel(pQVar1);
      } while (((!bVar3) && ((((pQVar1->d_ptr).d)->field_0x166 & 2) == 0)) &&
              (bVar3 = lVar15 * 8 + -8 != lVar17, lVar17 = lVar17 + 8, bVar3));
      bVar3 = true;
    }
LAB_0060283c:
    lVar15 = (this->modalPanels).d.size;
    if (lVar15 != 0) {
      ppQVar18 = (this->modalPanels).d.ptr;
      lVar17 = 0;
      do {
        PVar7 = QGraphicsItem::panelModality(*(QGraphicsItem **)((long)ppQVar18 + lVar17));
        if (PVar7 == SceneModal) {
          lVar15 = (this->cachedItemsUnderMouse).d.size;
          if (lVar15 != 0) goto LAB_006028df;
          local_58.d = (Data *)*(this->modalPanels).d.ptr;
          QtPrivate::QPodArrayOps<QGraphicsItem*>::emplace<QGraphicsItem*&>
                    ((QPodArrayOps<QGraphicsItem*> *)this_00,0,(QGraphicsItem **)&local_58);
          QList<QGraphicsItem_*>::end(this_00);
          goto LAB_006028cf;
        }
        lVar17 = lVar17 + 8;
      } while (lVar15 << 3 != lVar17);
    }
    if (bVar3 && (this->field_0xb9 & 2) == 0) {
      setFocusItemHelper(*(QGraphicsScenePrivate **)(this_01 + 8),(QGraphicsItem *)0x0,
                         MouseFocusReason,true);
    }
LAB_006028cf:
    lVar15 = (this->cachedItemsUnderMouse).d.size;
    if (lVar15 != 0) {
LAB_006028df:
      ppQVar18 = (this->cachedItemsUnderMouse).d.ptr;
      ppQVar16 = ppQVar18 + lVar15;
      do {
        local_78 = *ppQVar18;
        MVar8 = QGraphicsItem::acceptedMouseButtons(local_78);
        MVar9 = QGraphicsSceneMouseEvent::button(mouseEvent);
        if ((MVar9 & (uint)MVar8.super_QFlagsStorageHelper<Qt::MouseButton,_4>.
                           super_QFlagsStorage<Qt::MouseButton>.i) != NoButton) {
          QGraphicsItem::isBlockedByModalPanel(local_78,&local_78);
          grabMouse(this,local_78,true);
          (mouseEvent->super_QGraphicsSceneEvent).field_0xc = 1;
          bVar3 = QGraphicsItem::isEnabled(local_78);
          bVar4 = QGraphicsItem::isPanel(local_78);
          if ((*(short *)&(mouseEvent->super_QGraphicsSceneEvent).field_0x8 == 0x9e) &&
             (this->lastMouseGrabberItem != (QGraphicsItem *)0x0 &&
              local_78 != this->lastMouseGrabberItem)) {
            local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_58.ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
            QGraphicsSceneMouseEvent::QGraphicsSceneMouseEvent
                      ((QGraphicsSceneMouseEvent *)&local_58,GraphicsSceneMousePress);
            ppQVar2 = local_58.ptr;
            local_58.ptr._5_3_ = SUB83(ppQVar2,5);
            local_58.ptr._0_5_ =
                 CONCAT14(1,CONCAT13((mouseEvent->super_QGraphicsSceneEvent).field_0xb,
                                     local_58.ptr._0_3_));
            MVar9 = QGraphicsSceneMouseEvent::button(mouseEvent);
            QGraphicsSceneMouseEvent::setButton((QGraphicsSceneMouseEvent *)&local_58,MVar9);
            MVar8 = QGraphicsSceneMouseEvent::buttons(mouseEvent);
            QGraphicsSceneMouseEvent::setButtons((QGraphicsSceneMouseEvent *)&local_58,MVar8);
            local_70.xp = (qreal)QGraphicsSceneMouseEvent::screenPos(mouseEvent);
            QGraphicsSceneMouseEvent::setScreenPos
                      ((QGraphicsSceneMouseEvent *)&local_58,(QPoint *)&local_70);
            QVar19 = QGraphicsSceneMouseEvent::scenePos(mouseEvent);
            local_70.yp = QVar19.yp;
            local_70.xp = QVar19.xp;
            QGraphicsSceneMouseEvent::setScenePos((QGraphicsSceneMouseEvent *)&local_58,&local_70);
            KVar12 = QGraphicsSceneMouseEvent::modifiers(mouseEvent);
            QGraphicsSceneMouseEvent::setModifiers((QGraphicsSceneMouseEvent *)&local_58,KVar12);
            pQVar13 = QGraphicsSceneEvent::widget(&mouseEvent->super_QGraphicsSceneEvent);
            QGraphicsSceneEvent::setWidget((QGraphicsSceneEvent *)&local_58,pQVar13);
            MVar9 = QGraphicsSceneMouseEvent::button(mouseEvent);
            MVar10 = QGraphicsSceneMouseEvent::button(mouseEvent);
            QVar19 = QGraphicsSceneMouseEvent::buttonDownPos(mouseEvent,MVar10);
            local_70.yp = QVar19.yp;
            local_70.xp = QVar19.xp;
            QGraphicsSceneMouseEvent::setButtonDownPos
                      ((QGraphicsSceneMouseEvent *)&local_58,MVar9,&local_70);
            MVar9 = QGraphicsSceneMouseEvent::button(mouseEvent);
            MVar10 = QGraphicsSceneMouseEvent::button(mouseEvent);
            QVar19 = QGraphicsSceneMouseEvent::buttonDownScenePos(mouseEvent,MVar10);
            local_70.yp = QVar19.yp;
            local_70.xp = QVar19.xp;
            QGraphicsSceneMouseEvent::setButtonDownScenePos
                      ((QGraphicsSceneMouseEvent *)&local_58,MVar9,&local_70);
            MVar9 = QGraphicsSceneMouseEvent::button(mouseEvent);
            MVar10 = QGraphicsSceneMouseEvent::button(mouseEvent);
            local_70.xp = (qreal)QGraphicsSceneMouseEvent::buttonDownScreenPos(mouseEvent,MVar10);
            QGraphicsSceneMouseEvent::setButtonDownScreenPos
                      ((QGraphicsSceneMouseEvent *)&local_58,MVar9,(QPoint *)&local_70);
            sendMouseEvent(this,(QGraphicsSceneMouseEvent *)&local_58);
            (**(code **)(*(long *)&mouseEvent->super_QGraphicsSceneEvent + 0x10))
                      (mouseEvent,local_58.ptr._4_1_);
            QGraphicsSceneHelpEvent::~QGraphicsSceneHelpEvent((QGraphicsSceneHelpEvent *)&local_58);
          }
          else {
            sendMouseEvent(this,mouseEvent);
          }
          lVar15 = (this->mouseGrabberItems).d.size;
          if (lVar15 == 0) {
            itemIsDying = true;
          }
          else {
            itemIsDying = (this->mouseGrabberItems).d.ptr[lVar15 + -1] != local_78;
          }
          if (!bVar3) {
            ungrabMouse(this,local_78,itemIsDying);
            break;
          }
          if ((mouseEvent->super_QGraphicsSceneEvent).field_0xc == '\x01') {
            if (lVar15 != 0) {
              storeMouseButtonsForMouseGrabber(this,mouseEvent);
            }
            this->lastMouseGrabberItem = local_78;
            goto LAB_00602c24;
          }
          ungrabMouse(this,local_78,itemIsDying);
          if (bVar4) break;
        }
        ppQVar18 = ppQVar18 + 1;
      } while (ppQVar18 != ppQVar16);
    }
    if ((mouseEvent->super_QGraphicsSceneEvent).field_0xc == '\0') {
      if ((this->mouseGrabberItems).d.size != 0) {
        QGraphicsItem::ungrabMouse(*(this->mouseGrabberItems).d.ptr);
      }
      this->lastMouseGrabberItem = (QGraphicsItem *)0x0;
      pQVar13 = QGraphicsSceneEvent::widget(&mouseEvent->super_QGraphicsSceneEvent);
      bVar3 = false;
      if (pQVar13 != (QWidget *)0x0) {
        QGraphicsSceneEvent::widget(&mouseEvent->super_QGraphicsSceneEvent);
        this_02 = (QGraphicsView *)QMetaObject::cast((QObject *)&QGraphicsView::staticMetaObject);
        if (this_02 != (QGraphicsView *)0x0) {
          DVar11 = QGraphicsView::dragMode(this_02);
          bVar3 = DVar11 == ScrollHandDrag;
        }
      }
      KVar12 = QGraphicsSceneMouseEvent::modifiers(mouseEvent);
      if (((uint)KVar12.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
                 super_QFlagsStorage<Qt::KeyboardModifier>.i >> 0x1a & 1) == 0 && !bVar3) {
        QGraphicsScene::clearSelection(this_01);
      }
    }
  }
  else {
    bVar3 = QGraphicsItem::isBlockedByModalPanel
                      ((this->mouseGrabberItems).d.ptr[lVar15 + -1],(QGraphicsItem **)0x0);
    if (!bVar3) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        sendMouseEvent(this,mouseEvent);
        return;
      }
      goto LAB_00602c54;
    }
  }
LAB_00602c24:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00602c54:
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::mousePressEventHandler(QGraphicsSceneMouseEvent *mouseEvent)
{
    Q_Q(QGraphicsScene);

    // Ignore by default, unless we find a mouse grabber that accepts it.
    mouseEvent->ignore();

    // Deliver to any existing mouse grabber.
    if (!mouseGrabberItems.isEmpty()) {
        if (mouseGrabberItems.constLast()->isBlockedByModalPanel())
            return;
        // The event is ignored by default, but we disregard the event's
        // accepted state after delivery; the mouse is grabbed, after all.
        sendMouseEvent(mouseEvent);
        return;
    }

    // Start by determining the number of items at the current position.
    // Reuse value from earlier calculations if possible.
    if (cachedItemsUnderMouse.isEmpty()) {
        cachedItemsUnderMouse = itemsAtPosition(mouseEvent->screenPos(),
                                                mouseEvent->scenePos(),
                                                mouseEvent->widget());
    }

    // Update window activation.
    QGraphicsItem *topItem = cachedItemsUnderMouse.value(0);
    QGraphicsWidget *newActiveWindow = topItem ? topItem->window() : nullptr;
    if (newActiveWindow && newActiveWindow->isBlockedByModalPanel(&topItem)) {
        // pass activation to the blocking modal window
        newActiveWindow = topItem ? topItem->window() : nullptr;
    }

    if (newActiveWindow != q->activeWindow())
        q->setActiveWindow(newActiveWindow);

    // Set focus on the topmost enabled item that can take focus.
    bool setFocus = false;

    for (QGraphicsItem *item : std::as_const(cachedItemsUnderMouse)) {
        if (item->isBlockedByModalPanel()
            || (item->d_ptr->flags & QGraphicsItem::ItemStopsFocusHandling)) {
            // Make sure we don't clear focus.
            setFocus = true;
            break;
        }
        if (item->isEnabled() && ((item->flags() & QGraphicsItem::ItemIsFocusable))) {
            if (!item->isWidget() || ((QGraphicsWidget *)item)->focusPolicy() & Qt::ClickFocus) {
                setFocus = true;
                if (item != q->focusItem() && item->d_ptr->mouseSetsFocus)
                    q->setFocusItem(item, Qt::MouseFocusReason);
                break;
            }
        }
        if (item->isPanel())
            break;
        if (item->d_ptr->flags & QGraphicsItem::ItemStopsClickFocusPropagation)
            break;
    }

    // Check for scene modality.
    bool sceneModality = false;
    for (auto modalPanel : std::as_const(modalPanels)) {
        if (modalPanel->panelModality() == QGraphicsItem::SceneModal) {
            sceneModality = true;
            break;
        }
    }

    // If nobody could take focus, clear it.
    if (!stickyFocus && !setFocus && !sceneModality)
        q->setFocusItem(nullptr, Qt::MouseFocusReason);

    // Any item will do.
    if (sceneModality && cachedItemsUnderMouse.isEmpty())
        cachedItemsUnderMouse << modalPanels.constFirst();

    // Find a mouse grabber by sending mouse press events to all mouse grabber
    // candidates one at a time, until the event is accepted. It's accepted by
    // default, so the receiver has to explicitly ignore it for it to pass
    // through.
    for (QGraphicsItem *item : std::as_const(cachedItemsUnderMouse)) {
        if (!(item->acceptedMouseButtons() & mouseEvent->button())) {
            // Skip items that don't accept the event's mouse button.
            continue;
        }

        // Check if this item is blocked by a modal panel and deliver the mouse event to the
        // blocking panel instead of this item if blocked.
        (void) item->isBlockedByModalPanel(&item);

        grabMouse(item, /* implicit = */ true);
        mouseEvent->accept();

        // check if the item we are sending to are disabled (before we send the event)
        bool disabled = !item->isEnabled();
        bool isPanel = item->isPanel();
        if (mouseEvent->type() == QEvent::GraphicsSceneMouseDoubleClick
            && item != lastMouseGrabberItem && lastMouseGrabberItem) {
            // If this item is different from the item that received the last
            // mouse event, and mouseEvent is a double-click event, then the
            // event is converted to a press. Known limitation:
            // Triple-clicking will not generate a double-click, though.
            QGraphicsSceneMouseEvent mousePress(QEvent::GraphicsSceneMousePress);
            mousePress.m_spont = mouseEvent->spontaneous();
            mousePress.accept();
            mousePress.setButton(mouseEvent->button());
            mousePress.setButtons(mouseEvent->buttons());
            mousePress.setScreenPos(mouseEvent->screenPos());
            mousePress.setScenePos(mouseEvent->scenePos());
            mousePress.setModifiers(mouseEvent->modifiers());
            mousePress.setWidget(mouseEvent->widget());
            mousePress.setButtonDownPos(mouseEvent->button(),
                                        mouseEvent->buttonDownPos(mouseEvent->button()));
            mousePress.setButtonDownScenePos(mouseEvent->button(),
                                             mouseEvent->buttonDownScenePos(mouseEvent->button()));
            mousePress.setButtonDownScreenPos(mouseEvent->button(),
                                              mouseEvent->buttonDownScreenPos(mouseEvent->button()));
            sendMouseEvent(&mousePress);
            mouseEvent->setAccepted(mousePress.isAccepted());
        } else {
            sendMouseEvent(mouseEvent);
        }

        bool dontSendUngrabEvents = mouseGrabberItems.isEmpty() || mouseGrabberItems.constLast() != item;
        if (disabled) {
            ungrabMouse(item, /* itemIsDying = */ dontSendUngrabEvents);
            break;
        }
        if (mouseEvent->isAccepted()) {
            if (!mouseGrabberItems.isEmpty())
                storeMouseButtonsForMouseGrabber(mouseEvent);
            lastMouseGrabberItem = item;
            return;
        }
        ungrabMouse(item, /* itemIsDying = */ dontSendUngrabEvents);

        // Don't propagate through panels.
        if (isPanel)
            break;
    }

    // Is the event still ignored? Then the mouse press goes to the scene.
    // Reset the mouse grabber, clear the selection, clear focus, and leave
    // the event ignored so that it can propagate through the originating
    // view.
    if (!mouseEvent->isAccepted()) {
        clearMouseGrabber();

        QGraphicsView *view = mouseEvent->widget() ? qobject_cast<QGraphicsView *>(mouseEvent->widget()->parentWidget()) : 0;
        bool dontClearSelection = view && view->dragMode() == QGraphicsView::ScrollHandDrag;
        bool extendSelection = (mouseEvent->modifiers() & Qt::ControlModifier) != 0;
        dontClearSelection |= extendSelection;
        if (!dontClearSelection) {
            // Clear the selection if the originating view isn't in scroll
            // hand drag mode. The view will clear the selection if no drag
            // happened.
            q->clearSelection();
        }
    }
}